

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

void __thiscall QScrollerPrivate::setState(QScrollerPrivate *this,State newstate)

{
  char *pcVar1;
  long *plVar2;
  State SVar3;
  long lVar4;
  qreal qVar5;
  int *piVar6;
  DataPointer *pDVar7;
  QDebug QVar8;
  Type *c;
  QPodArrayOps<QScroller*> *this_00;
  char *pcVar9;
  storage_type *psVar10;
  QScrollerPrivate *this_01;
  QScrollerPrivate *pQVar11;
  long lVar12;
  byte bVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QScroller *q;
  undefined1 auStack_98 [8];
  QDebug local_90;
  QScroller *local_88;
  State local_80;
  undefined4 uStack_7c;
  undefined1 local_68 [8];
  State *pSStack_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  _func_int **pp_Stack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 *local_38;
  qreal local_30;
  
  pQVar11 = (QScrollerPrivate *)auStack_98;
  local_30 = *(qreal *)(in_FS_OFFSET + 0x28);
  local_88 = this->q_ptr;
  if (this->state == newstate) goto LAB_00661b71;
  this_01 = this;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_68._0_4_ = TapAndHoldGesture;
    local_68._4_4_ = 0;
    pSStack_60 = (State *)0x0;
    uStack_58 = 0;
    uStack_54 = 0;
    pp_Stack_50 = (_func_int **)lcScroller::category.name;
    QMessageLogger::debug();
    ::operator<<((Stream *)&local_90,(QObject *)auStack_98);
    QVar8.stream = local_90.stream;
    QVar15.m_data = (storage_type *)0x14;
    QVar15.m_size = (qsizetype)&local_80;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_80);
    piVar6 = (int *)CONCAT44(uStack_7c,local_80);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_7c,local_80),2,0x10);
      }
    }
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    QVar8.stream = local_90.stream;
    if (newstate < 4) {
      pcVar9 = *(char **)(&DAT_00823cd8 + (ulong)newstate * 8);
    }
    else {
      pcVar9 = "(invalid)";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar16.m_data = psVar10;
    QVar16.m_size = (qsizetype)&local_80;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_80);
    piVar6 = (int *)CONCAT44(uStack_7c,local_80);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_7c,local_80),2,0x10);
      }
    }
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_90.stream,')');
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    QDebug::~QDebug(&local_90);
    QDebug::~QDebug((QDebug *)auStack_98);
    this_01 = pQVar11;
  }
  switch((ulong)newstate) {
  case 0:
    this_01 = (QScrollerPrivate *)this->scrollTimer;
    QAbstractAnimation::stop();
    bVar13 = this->firstScroll ^ 1;
    (this->releaseVelocity).xp = 0.0;
    (this->releaseVelocity).yp = 0.0;
    break;
  case 1:
    this_01 = (QScrollerPrivate *)this->scrollTimer;
    QAbstractAnimation::stop();
    qVar5 = (this->releaseVelocity).yp;
    (this->oldVelocity).xp = (this->releaseVelocity).xp;
    (this->oldVelocity).yp = qVar5;
    (this->releaseVelocity).xp = 0.0;
    (this->releaseVelocity).yp = 0.0;
  default:
    bVar13 = 0;
    break;
  case 2:
    (this->dragDistance).xp = 0.0;
    (this->dragDistance).yp = 0.0;
    bVar14 = this->state == Pressed;
    goto LAB_006619e3;
  case 3:
    bVar14 = true;
LAB_006619e3:
    bVar13 = 0;
    goto LAB_00661a15;
  }
  bVar14 = false;
LAB_00661a15:
  this->state = newstate;
  if (bVar14) {
    pQVar11 = (QScrollerPrivate *)this->scrollTimer;
    this_01 = pQVar11;
    QAbstractAnimation::start((DeletionPolicy)pQVar11);
    *(undefined4 *)&(pQVar11->properties)._vptr_QScrollerProperties = 0;
  }
  if (bVar13 != 0) {
    this_01 = (QScrollerPrivate *)local_68;
    local_68._0_4_ = 0xaaaaaaaa;
    local_68._4_4_ = 0xaaaaaaaa;
    pSStack_60 = (State *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_58 = 0xffffffff;
    uStack_54 = 0xffffffff;
    pp_Stack_50 = (_func_int **)0xffffffffffffffff;
    local_48 = 0xffffffff;
    uStack_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    uStack_3c = 0xffffffff;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QScrollEvent::QScrollEvent
              ((QScrollEvent *)this_01,&this->contentPosition,&this->overshootPosition,
               ScrollFinished);
    qt_sendSpontaneousEvent(this->target,(QEvent *)this_01);
    this->firstScroll = true;
    QScrollEvent::~QScrollEvent((QScrollEvent *)this_01);
  }
  SVar3 = this->state;
  c = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>::
      operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                  *)this_01);
  if ((SVar3 & ~Pressed) == Dragging) {
    lVar4 = (c->d).size;
    if (lVar4 == 0) {
LAB_00661af2:
      c = (Type *)0xffffffffffffffff;
    }
    else {
      pDVar7 = &c->d;
      lVar12 = -8;
      do {
        this_01 = (QScrollerPrivate *)(lVar4 * -8 + lVar12);
        if (this_01 == (QScrollerPrivate *)0xfffffffffffffff8) goto LAB_00661aec;
        c = (Type *)(lVar12 + 8);
        plVar2 = (long *)((long)(pDVar7->ptr + 1) + lVar12);
        lVar12 = (long)c;
      } while ((QScroller *)*plVar2 != local_88);
      c = (Type *)((long)c >> 3);
LAB_00661aec:
      if (this_01 == (QScrollerPrivate *)0xfffffffffffffff8) goto LAB_00661af2;
    }
    if (c == (Type *)0xffffffffffffffff) {
      this_00 = (QPodArrayOps<QScroller*> *)
                QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                              *)this_01);
      local_68._0_4_ = SUB84(local_88,0);
      local_68._4_4_ = (undefined4)((ulong)local_88 >> 0x20);
      QtPrivate::QPodArrayOps<QScroller*>::emplace<QScroller*&>
                (this_00,*(qsizetype *)(this_00 + 0x10),(QScroller **)local_68);
      QList<QScroller_*>::end((QList<QScroller_*> *)this_00);
    }
  }
  else {
    QtPrivate::sequential_erase_one<QList<QScroller*>,QScroller*>(c,&local_88);
  }
  local_80 = this->state;
  pSStack_60 = &local_80;
  local_68._0_4_ = ~LastGestureType;
  local_68._4_4_ = 0;
  QMetaObject::activate(&local_88->super_QObject,&QScroller::staticMetaObject,0,(void **)local_68);
LAB_00661b71:
  if (*(qreal *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollerPrivate::setState(QScroller::State newstate)
{
    Q_Q(QScroller);
    bool sendLastScroll = false;
    bool startTimer = false;

    if (state == newstate)
        return;

    qCDebug(lcScroller) << q << "QScroller::setState(" << stateName(newstate) << ')';

    switch (newstate) {
    case QScroller::Inactive:
#if QT_CONFIG(animation)
        scrollTimer->stop();
#endif

        // send the last scroll event (but only after the current state change was finished)
        if (!firstScroll)
            sendLastScroll = true;

        releaseVelocity = QPointF(0, 0);
        break;

    case QScroller::Pressed:
#if QT_CONFIG(animation)
        scrollTimer->stop();
#endif

        oldVelocity = releaseVelocity;
        releaseVelocity = QPointF(0, 0);
        break;

    case QScroller::Dragging:
        dragDistance = QPointF(0, 0);
#if QT_CONFIG(animation)
        if (state == QScroller::Pressed)
            startTimer = true;
#endif
        break;

    case QScroller::Scrolling:
#if QT_CONFIG(animation)
        startTimer = true;
#endif
        break;
    }

    qSwap(state, newstate);

#if QT_CONFIG(animation)
    // Only start the timer after the state has been changed
    if (startTimer)
        scrollTimer->start();
#endif
    if (sendLastScroll) {
        QScrollEvent se(contentPosition, overshootPosition, QScrollEvent::ScrollFinished);
        sendEvent(target, &se);
        firstScroll = true;
    }
    if (state == QScroller::Dragging || state == QScroller::Scrolling) {
        if (!qt_activeScrollers()->contains(q))
            qt_activeScrollers()->push_back(q);
    } else {
        qt_activeScrollers()->removeOne(q);
    }
    emit q->stateChanged(state);
}